

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstruction *
anon_unknown.dwarf_c91b1::GetCopyInfo
          (VmModule *module,VmValue *pointer,VmConstant *offset,uint accessSize)

{
  uint uVar1;
  VmConstant *pVVar2;
  LoadStoreInfo *pLVar3;
  int local_5c;
  LoadStoreInfo *el_1;
  uint i_1;
  LoadStoreInfo *el;
  uint i;
  VmConstant *address;
  int offsetValue;
  uint accessSize_local;
  VmConstant *offset_local;
  VmValue *pointer_local;
  VmModule *module_local;
  
  if (offset == (VmConstant *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = offset->iValue;
  }
  pVVar2 = getType<VmConstant>(pointer);
  if (pVVar2 == (VmConstant *)0x0) {
    for (el_1._4_4_ = 0;
        uVar1 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo),
        el_1._4_4_ < uVar1; el_1._4_4_ = el_1._4_4_ + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[]
                         (&module->loadStoreInfo,el_1._4_4_);
      if ((((pLVar3->copyInst != (VmInstruction *)0x0) && (pLVar3->storePointer != (VmValue *)0x0))
          && (pLVar3->storePointer == pointer)) &&
         ((pLVar3->storeOffset->iValue == local_5c && (accessSize == pLVar3->accessSize)))) {
        if (pLVar3->copyInst->parent != (VmBlock *)0x0) {
          return pLVar3->copyInst;
        }
        __assert_fail("el.copyInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x701,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
    }
  }
  else {
    if (pVVar2->container == (VariableData *)0x0) {
      return (VmInstruction *)0x0;
    }
    if (local_5c != 0) {
      __assert_fail("offsetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x6e6,
                    "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                   );
    }
    for (el._4_4_ = 0;
        uVar1 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo),
        el._4_4_ < uVar1; el._4_4_ = el._4_4_ + 1) {
      pLVar3 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_)
      ;
      if (((pLVar3->copyInst != (VmInstruction *)0x0) && (pLVar3->storeAddress != (VmConstant *)0x0)
          ) && ((pLVar3->storeAddress->container == pVVar2->container &&
                ((pLVar3->storeAddress->iValue == pVVar2->iValue &&
                 (accessSize == pLVar3->accessSize)))))) {
        if (pLVar3->copyInst->parent != (VmBlock *)0x0) {
          return pLVar3->copyInst;
        }
        __assert_fail("el.copyInst->parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x6f0,
                      "VmInstruction *(anonymous namespace)::GetCopyInfo(VmModule *, VmValue *, VmConstant *, unsigned int)"
                     );
      }
    }
  }
  return (VmInstruction *)0x0;
}

Assistant:

VmInstruction* GetCopyInfo(VmModule *module, VmValue *pointer, VmConstant *offset, unsigned accessSize)
	{
		int offsetValue = offset ? offset->iValue : 0;

		if(VmConstant *address = getType<VmConstant>(pointer))
		{
			if(!address->container)
				return NULL;

			assert(offsetValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storeAddress)
				{
					if(el.storeAddress->container == address->container && el.storeAddress->iValue == address->iValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				if(el.copyInst && el.storePointer)
				{
					if(el.storePointer == pointer && el.storeOffset->iValue == offsetValue && accessSize == el.accessSize)
					{
						assert(el.copyInst->parent);

						return el.copyInst;
					}
				}
			}
		}

		return NULL;
	}